

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_math.cpp
# Opt level: O1

void ON_Sort(sort_algorithm method,uint *index,void *data,size_t count,size_t sizeof_element,
            _func_int_void_ptr_void_ptr_void_ptr *compar,void *p)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  void *pvVar6;
  uint uVar7;
  uint uVar8;
  tagON_SORT_CONTEXT context;
  void *local_78;
  void *pvStack_70;
  undefined8 local_68;
  _func_int_void_ptr_void_ptr_void_ptr *p_Stack_60;
  ulong local_50;
  ulong local_48;
  size_t local_40;
  ulong local_38;
  
  if (sizeof_element == 0 || (index == (uint *)0x0 || count == 0)) {
    return;
  }
  if (count == 1) {
    *index = 0;
    return;
  }
  iVar2 = (int)count;
  if (iVar2 != 0) {
    lVar4 = 0;
    uVar5 = 0;
    do {
      index[lVar4] = uVar5;
      uVar5 = uVar5 + (int)sizeof_element;
      lVar4 = lVar4 + 1;
    } while (iVar2 != (int)lVar4);
  }
  local_68 = 0;
  local_78 = p;
  pvStack_70 = data;
  p_Stack_60 = compar;
  if (method != quick_sort) {
    local_48 = count >> 1 & 0x7fffffff;
    uVar5 = iVar2 - 1;
    local_40 = count;
    local_38 = sizeof_element;
    do {
      if ((int)local_48 == 0) {
        uVar7 = index[uVar5];
        index[uVar5] = *index;
        uVar3 = 0;
        uVar5 = uVar5 - 1;
        if (uVar5 == 0) goto LAB_004f4db3;
      }
      else {
        uVar3 = (ulong)((int)local_48 - 1);
        uVar7 = index[uVar3];
      }
      local_50 = (ulong)uVar7;
      pvVar6 = (void *)(local_50 + (long)pvStack_70);
      uVar7 = (int)uVar3 * 2;
      local_48 = uVar3;
      if (uVar7 < uVar5) {
        uVar7 = uVar7 | 1;
        do {
          if ((uVar7 < uVar5) &&
             (iVar2 = (*p_Stack_60)((void *)((ulong)index[uVar7] + (long)pvStack_70),
                                    (void *)((ulong)index[(ulong)uVar7 + 1] + (long)pvStack_70),
                                    local_78), iVar2 < 0)) {
            uVar7 = uVar7 + 1;
          }
          iVar2 = (*p_Stack_60)(pvVar6,(void *)((ulong)index[uVar7] + (long)pvStack_70),local_78);
          uVar8 = (uint)uVar3;
          uVar1 = uVar5;
          if (iVar2 < 0) {
            index[uVar3] = index[uVar7];
            uVar8 = uVar7;
            uVar1 = uVar7 * 2;
          }
          uVar7 = uVar1 + 1;
          uVar3 = (ulong)uVar8;
        } while (uVar7 <= uVar5);
      }
      index[uVar3] = (uint)local_50;
    } while( true );
  }
  ON_qsort(index,count,4,qicompar3,&local_78);
LAB_004f4dc0:
  if ((int)count != 0) {
    lVar4 = 0;
    do {
      index[lVar4] = (uint)((ulong)index[lVar4] / (sizeof_element & 0xffffffff));
      lVar4 = lVar4 + 1;
    } while ((int)count != (int)lVar4);
  }
  return;
LAB_004f4db3:
  *index = uVar7;
  sizeof_element = local_38;
  count = local_40;
  goto LAB_004f4dc0;
}

Assistant:

void
ON_Sort( ON::sort_algorithm method, 
  unsigned int* index, 
  const void* data, 
  size_t count, 
  size_t sizeof_element, 
  int (*compar)(const void*,const void*,void*),
  void* p
  )
{
  tagON_SORT_CONTEXT context;
  unsigned int* idx;
  const void* tmp;
  unsigned int i, j, k, tmpi, icount, isizeof_element;
  
  if (count < 1 || 0 == index || sizeof_element <= 0) 
  {
    return;
  }
  if (1 == count) 
  {
    index[0]=0;
    return;
  }

  isizeof_element = (unsigned int)sizeof_element; // (int) converts 64 bit size_t
  icount = (unsigned int)count;
  idx = index;
  
  for ( i = 0; icount--; i += isizeof_element )
  {
    *idx++ = i;
  }

  memset(&context,0,sizeof(context));
  context.users_context = p;
  context.qdata = (const unsigned char*)data;
  context.compar3 = compar;
  idx = index;
  if ( ON::sort_algorithm::quick_sort == method )
  {
    ON_qsort(idx,count,sizeof(idx[0]),qicompar3,&context);
  }
  else
  {
    // heap sort
    icount = (unsigned int)count;

    k = icount >> 1;
    icount--;
    for (;;) 
    {
      if (k) 
      {
        tmpi = idx[--k];
        tmp  = context.qdata + tmpi;
      }
      else 
      {
        tmpi = idx[icount];
        tmp  = context.qdata + tmpi;
        idx[icount] = idx[0];
        if (!(--icount)) 
        {
          idx[0] = tmpi;
          break;
        }
      }
      i = k;
      j = (k<<1) + 1;
      while (j <= icount) 
      {
        if (j < icount && context.compar3(context.qdata + idx[j], context.qdata + idx[j+1], context.users_context) < 0) 
        {
          j++;
        }
        if (context.compar3(tmp,context.qdata + idx[j], context.users_context) < 0) 
        {
          idx[i] = idx[j];
          i = j;
          j = (j<<1) + 1;
        } 
        else 
        {
          j = icount + 1;
        }
      }
      idx[i] = tmpi;
    }
  }

  for (i = (unsigned int)count; i--; idx++ )
  {
    *idx /= isizeof_element;
  }
}